

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O2

png_uint_32
png_get_cHRM_XYZ_fixed
          (png_const_structrp png_ptr,png_const_inforp info_ptr,png_fixed_point *int_red_X,
          png_fixed_point *int_red_Y,png_fixed_point *int_red_Z,png_fixed_point *int_green_X,
          png_fixed_point *int_green_Y,png_fixed_point *int_green_Z,png_fixed_point *int_blue_X,
          png_fixed_point *int_blue_Y,png_fixed_point *int_blue_Z)

{
  int iVar1;
  png_uint_32 pVar2;
  png_XYZ XYZ;
  
  pVar2 = 0;
  if ((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
     ((info_ptr->valid & 4) != 0)) {
    iVar1 = png_XYZ_from_xy(&XYZ,&info_ptr->cHRM);
    pVar2 = 0;
    if (iVar1 == 0) {
      if (int_red_X != (png_fixed_point *)0x0) {
        *int_red_X = XYZ.red_X;
      }
      if (int_red_Y != (png_fixed_point *)0x0) {
        *int_red_Y = XYZ.red_Y;
      }
      if (int_red_Z != (png_fixed_point *)0x0) {
        *int_red_Z = XYZ.red_Z;
      }
      if (int_green_X != (png_fixed_point *)0x0) {
        *int_green_X = XYZ.green_X;
      }
      if (int_green_Y != (png_fixed_point *)0x0) {
        *int_green_Y = XYZ.green_Y;
      }
      if (int_green_Z != (png_fixed_point *)0x0) {
        *int_green_Z = XYZ.green_Z;
      }
      if (int_blue_X != (png_fixed_point *)0x0) {
        *int_blue_X = XYZ.blue_X;
      }
      if (int_blue_Y != (png_fixed_point *)0x0) {
        *int_blue_Y = XYZ.blue_Y;
      }
      pVar2 = 4;
      if (int_blue_Z != (png_fixed_point *)0x0) {
        *int_blue_Z = XYZ.blue_Z;
      }
    }
  }
  return pVar2;
}

Assistant:

png_uint_32 PNGAPI
png_get_cHRM_XYZ_fixed(png_const_structrp png_ptr, png_const_inforp info_ptr,
    png_fixed_point *int_red_X, png_fixed_point *int_red_Y,
    png_fixed_point *int_red_Z, png_fixed_point *int_green_X,
    png_fixed_point *int_green_Y, png_fixed_point *int_green_Z,
    png_fixed_point *int_blue_X, png_fixed_point *int_blue_Y,
    png_fixed_point *int_blue_Z)
{
   png_XYZ XYZ;
   png_debug1(1, "in %s retrieval function", "cHRM_XYZ");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_cHRM) != 0U &&
       png_XYZ_from_xy(&XYZ, &info_ptr->cHRM) == 0)
   {
      if (int_red_X != NULL) *int_red_X = XYZ.red_X;
      if (int_red_Y != NULL) *int_red_Y = XYZ.red_Y;
      if (int_red_Z != NULL) *int_red_Z = XYZ.red_Z;
      if (int_green_X != NULL) *int_green_X = XYZ.green_X;
      if (int_green_Y != NULL) *int_green_Y = XYZ.green_Y;
      if (int_green_Z != NULL) *int_green_Z = XYZ.green_Z;
      if (int_blue_X != NULL) *int_blue_X = XYZ.blue_X;
      if (int_blue_Y != NULL) *int_blue_Y = XYZ.blue_Y;
      if (int_blue_Z != NULL) *int_blue_Z = XYZ.blue_Z;
      return PNG_INFO_cHRM;
   }

   return 0;
}